

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathStartsWithFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int iVar1;
  long lVar2;
  xmlXPathObjectPtr value;
  xmlXPathObjectPtr pxVar3;
  xmlXPathObjectPtr pxVar4;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 2) {
    if (ctxt->valueNr < 2) {
      iVar1 = 0x17;
    }
    else {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_STRING)) {
        iVar1 = ctxt->valueNr;
        lVar2 = (long)iVar1;
        if (lVar2 < 1) {
          pxVar3 = (xmlXPathObjectPtr)0x0;
        }
        else {
          ctxt->valueNr = iVar1 + -1;
          if (iVar1 == 1) {
            pxVar3 = (xmlXPathObjectPtr)0x0;
          }
          else {
            pxVar3 = ctxt->valueTab[lVar2 + -2];
          }
          ctxt->value = pxVar3;
          pxVar3 = ctxt->valueTab[lVar2 + -1];
          ctxt->valueTab[lVar2 + -1] = (xmlXPathObjectPtr)0x0;
        }
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
          xmlXPathStringFunction(ctxt,1);
        }
        iVar1 = ctxt->valueNr;
        lVar2 = (long)iVar1;
        if (lVar2 < 1) {
          pxVar4 = (xmlXPathObjectPtr)0x0;
        }
        else {
          ctxt->valueNr = iVar1 + -1;
          if (iVar1 == 1) {
            pxVar4 = (xmlXPathObjectPtr)0x0;
          }
          else {
            pxVar4 = ctxt->valueTab[lVar2 + -2];
          }
          ctxt->value = pxVar4;
          pxVar4 = ctxt->valueTab[lVar2 + -1];
          ctxt->valueTab[lVar2 + -1] = (xmlXPathObjectPtr)0x0;
        }
        if ((pxVar4 != (xmlXPathObjectPtr)0x0) && (pxVar4->type == XPATH_STRING)) {
          iVar1 = xmlStrlen(pxVar3->stringval);
          iVar1 = xmlStrncmp(pxVar4->stringval,pxVar3->stringval,iVar1);
          value = xmlXPathCacheNewBoolean(ctxt,(uint)(iVar1 == 0));
          xmlXPathValuePush(ctxt,value);
          xmlXPathReleaseObject(ctxt->context,pxVar4);
          xmlXPathReleaseObject(ctxt->context,pxVar3);
          return;
        }
        xmlXPathReleaseObject(ctxt->context,pxVar4);
        xmlXPathReleaseObject(ctxt->context,pxVar3);
      }
      iVar1 = 0xb;
    }
  }
  else {
    iVar1 = 0xc;
  }
  xmlXPathErr(ctxt,iVar1);
  return;
}

Assistant:

void
xmlXPathStartsWithFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr hay, needle;
    int n;

    CHECK_ARITY(2);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    needle = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    hay = xmlXPathValuePop(ctxt);

    if ((hay == NULL) || (hay->type != XPATH_STRING)) {
	xmlXPathReleaseObject(ctxt->context, hay);
	xmlXPathReleaseObject(ctxt->context, needle);
	XP_ERROR(XPATH_INVALID_TYPE);
    }
    n = xmlStrlen(needle->stringval);
    if (xmlStrncmp(hay->stringval, needle->stringval, n))
        xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, 0));
    else
        xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, 1));
    xmlXPathReleaseObject(ctxt->context, hay);
    xmlXPathReleaseObject(ctxt->context, needle);
}